

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCall_callWithoutParameterSetOrNotFound_Test::testBody
          (TEST_MockExpectedCall_callWithoutParameterSetOrNotFound_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_88;
  MockNamedValue local_78;
  
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_88,"nonexisting");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_78,pMVar1,&local_88);
  pcVar4 = SimpleString::asCharString((SimpleString *)&local_78);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xaf,pTVar5);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  SimpleString::~SimpleString(&local_88);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_88,"nonexisting");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_78,pMVar1,&local_88);
  iVar2 = MockNamedValue::getIntValue(&local_78);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar2,
             "LONGS_EQUAL(0, call->getInputParameter(\"nonexisting\").getIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xb0,pTVar5);
  MockNamedValue::~MockNamedValue(&local_78);
  SimpleString::~SimpleString(&local_88);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString((SimpleString *)&local_78,"nonexisting");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,&local_78);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK",
             "!call->hasInputParameterWithName(\"nonexisting\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xb1,pTVar5);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithoutParameterSetOrNotFound)
{
    STRCMP_EQUAL("", call->getInputParameterType("nonexisting").asCharString());
    LONGS_EQUAL(0, call->getInputParameter("nonexisting").getIntValue());
    CHECK(!call->hasInputParameterWithName("nonexisting"));
}